

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_val_default(gs_val_t *__return_storage_ptr__,gs_val_type type)

{
  vec2 v;
  vec3 v_00;
  gs_val_type type_local;
  
  switch(type) {
  case GS_VAL_VOID:
    gs_val_void();
    break;
  case GS_VAL_BOOL:
    gs_val_bool(__return_storage_ptr__,false);
    break;
  case GS_VAL_INT:
    gs_val_int(__return_storage_ptr__,0);
    break;
  case GS_VAL_FLOAT:
    gs_val_float(__return_storage_ptr__,0.0);
    break;
  case GS_VAL_VEC2:
    v = vec2_create(0.0,0.0);
    gs_val_vec2(__return_storage_ptr__,v);
    break;
  case GS_VAL_VEC3:
    v_00 = vec3_create(0.0,0.0,0.0);
    gs_val_vec3(__return_storage_ptr__,v_00);
    break;
  case GS_VAL_LIST:
    gs_val_list(__return_storage_ptr__,(vec_gs_val_t *)0x0);
    break;
  case GS_VAL_STRING:
    gs_val_string(__return_storage_ptr__,(golf_string_t *)0x0);
    break;
  case GS_VAL_FN:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa48,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_C_FN:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa4b,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_ERROR:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa4e,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_NUM_TYPES:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa51,"gs_val_t gs_val_default(gs_val_type)");
  default:
    gs_val_void();
  }
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_val_default(gs_val_type type) {
    switch (type) {
        case GS_VAL_VOID:
            return gs_val_void();
        case GS_VAL_BOOL:
            return gs_val_bool(false);
        case GS_VAL_INT:
            return gs_val_int(0);
        case GS_VAL_FLOAT:
            return gs_val_float(0);
        case GS_VAL_VEC2:
            return gs_val_vec2(V2(0, 0));
        case GS_VAL_VEC3:
            return gs_val_vec3(V3(0, 0, 0));
        case GS_VAL_LIST:
            return gs_val_list(NULL);
        case GS_VAL_STRING:
            return gs_val_string(NULL);
        case GS_VAL_FN:
            assert(false);
            break;
        case GS_VAL_C_FN:
            assert(false);
            break;
        case GS_VAL_ERROR:
            assert(false);
            break;
        case GS_VAL_NUM_TYPES:
            assert(false);
            break;
    }
    return gs_val_void();
}